

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.h
# Opt level: O2

void __thiscall roaring::Roaring::~Roaring(Roaring *this)

{
  if (((this->roaring).high_low_container.flags & 2) == 0) {
    roaring_bitmap_clear((roaring_bitmap_t *)this);
  }
  else {
    roaring_bitmap_free((roaring_bitmap_t *)((this->roaring).high_low_container.containers + -5));
  }
  return;
}

Assistant:

inline void roaring_bitmap_init_cleared(roaring_bitmap_t *r) {
    roaring_bitmap_init_with_capacity(r, 0);
}